

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast.hpp
# Opt level: O2

wchar_t chaiscript::boxed_cast<wchar_t>(Boxed_Value *bv,Type_Conversions_State *t_conversions)

{
  element_type *peVar1;
  type_info *ptVar2;
  type_info *ptVar3;
  bool bVar4;
  wchar_t wVar5;
  undefined8 *puVar6;
  undefined1 local_38 [16];
  uint local_28;
  undefined4 uStack_24;
  
  if (t_conversions != (Type_Conversions_State *)0x0) {
    local_38._0_8_ = &wchar_t::typeinfo;
    local_38._8_8_ = &wchar_t::typeinfo;
    local_28 = 0x10;
    bVar4 = Type_Info::bare_equal
                      (&((bv->m_data).
                         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->m_type_info,(Type_Info *)local_38);
    if ((!bVar4) &&
       (bVar4 = Type_Conversions::convertable_type<wchar_t>((t_conversions->m_conversions)._M_data),
       bVar4)) {
      bVar4 = Type_Conversions::convertable_type<wchar_t>((t_conversions->m_conversions)._M_data);
      if (bVar4) {
        Type_Conversions::boxed_type_conversion<wchar_t>
                  ((Type_Conversions *)local_38,
                   (Conversion_Saves *)(t_conversions->m_conversions)._M_data,
                   (Boxed_Value *)(t_conversions->m_saves)._M_data);
        wVar5 = detail::Cast_Helper_Inner<wchar_t>::cast((Boxed_Value *)local_38,t_conversions);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_38 + 8));
        return wVar5;
      }
      puVar6 = (undefined8 *)__cxa_allocate_exception(0x38);
      peVar1 = (bv->m_data).
               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_28 = (peVar1->m_type_info).m_flags;
      uStack_24 = *(undefined4 *)&(peVar1->m_type_info).field_0x14;
      ptVar2 = (peVar1->m_type_info).m_type_info;
      ptVar3 = (peVar1->m_type_info).m_bare_type_info;
      *puVar6 = &PTR__bad_cast_003bf648;
      local_38._0_4_ = SUB84(ptVar2,0);
      local_38._4_4_ = (undefined4)((ulong)ptVar2 >> 0x20);
      local_38._8_4_ = SUB84(ptVar3,0);
      local_38._12_4_ = (undefined4)((ulong)ptVar3 >> 0x20);
      *(undefined4 *)(puVar6 + 1) = local_38._0_4_;
      *(undefined4 *)((long)puVar6 + 0xc) = local_38._4_4_;
      *(undefined4 *)(puVar6 + 2) = local_38._8_4_;
      *(undefined4 *)((long)puVar6 + 0x14) = local_38._12_4_;
      puVar6[3] = _local_28;
      puVar6[4] = &wchar_t::typeinfo;
      puVar6[5] = 0x19;
      puVar6[6] = "Cannot perform boxed_cast";
      local_38._0_8_ = ptVar2;
      local_38._8_8_ = ptVar3;
      __cxa_throw(puVar6,&exception::bad_boxed_cast::typeinfo,std::bad_cast::~bad_cast);
    }
  }
  wVar5 = detail::Cast_Helper_Inner<wchar_t>::cast(bv,t_conversions);
  return wVar5;
}

Assistant:

decltype(auto) boxed_cast(const Boxed_Value &bv, const Type_Conversions_State *t_conversions = nullptr) {
    if (!t_conversions || bv.get_type_info().bare_equal(user_type<Type>()) || (t_conversions && !(*t_conversions)->convertable_type<Type>())) {
      try {
        return detail::Cast_Helper<Type>::cast(bv, t_conversions);
      } catch (const chaiscript::detail::exception::bad_any_cast &) {
      }
    }

    if (t_conversions && (*t_conversions)->convertable_type<Type>()) {
      try {
        // We will not catch any bad_boxed_dynamic_cast that is thrown, let the user get it
        // either way, we are not responsible if it doesn't work
        return (detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_conversion<Type>(t_conversions->saves(), bv), t_conversions));
      } catch (...) {
        try {
          // try going the other way
          return (detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_down_conversion<Type>(t_conversions->saves(), bv),
                                                  t_conversions));
        } catch (const chaiscript::detail::exception::bad_any_cast &) {
          throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
        }
      }
    } else {
      // If it's not convertable, just throw the error, don't waste the time on the
      // attempted dynamic_cast
      throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
    }
  }